

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::Integer::IsSameImpl(Integer *this,Type *that,IsSameCache *param_2)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*that->_vptr_Type[10])(that);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (((lVar3 != 0) && (*(int *)&(this->super_Type).field_0x24 == *(int *)(lVar3 + 0x24))) &&
     (this->signed_ == (bool)*(char *)(lVar3 + 0x28))) {
    bVar1 = analysis::Type::HasSameDecorations(&this->super_Type,that);
    return bVar1;
  }
  return false;
}

Assistant:

bool Integer::IsSameImpl(const Type* that, IsSameCache*) const {
  const Integer* it = that->AsInteger();
  return it && width_ == it->width_ && signed_ == it->signed_ &&
         HasSameDecorations(that);
}